

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall Nova::Driver<float,_2>::Write_Last_Frame(Driver<float,_2> *this,int frame)

{
  __cxx11 local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  __cxx11 local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  Driver<float,_2> *pDStack_10;
  int frame_local;
  Driver<float,_2> *this_local;
  
  local_14 = frame;
  pDStack_10 = this;
  std::operator+(local_38,(char *)&this->example->output_directory);
  std::__cxx11::to_string(local_58,local_14);
  File_Utilities::Write_To_Text_File<std::__cxx11::string>
            (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
  ;
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_38);
  std::operator+(local_88,(char *)&this->example->output_directory);
  std::__cxx11::to_string(local_a8,local_14);
  File_Utilities::Write_To_Text_File<std::__cxx11::string>
            (local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8)
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void Driver<T,d>::
Write_Last_Frame(const int frame) const
{
    File_Utilities::Write_To_Text_File(example.output_directory+"/common/last_frame",std::to_string(frame));
    File_Utilities::Write_To_Text_File(example.output_directory+"/info.nova-animation",std::to_string(frame));
}